

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O1

void __thiscall n_e_s::core::Mapper2::ppu_write_byte(Mapper2 *this,uint16_t addr,uint8_t byte)

{
  pointer puVar1;
  pair<int,_unsigned_short> pVar2;
  undefined6 in_register_00000032;
  
  if ((uint)CONCAT62(in_register_00000032,addr) < 0x2000) {
    puVar1 = (this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->chr_mem_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1) <= (ulong)addr) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    puVar1[addr] = byte;
  }
  pVar2 = translate_nametable_addr(this,addr,(this->super_IRom).header_.flags_6 & Vertical);
  (this->nametables_)._M_elems[pVar2.first]._M_elems[(ulong)pVar2 >> 0x20 & 0xffff] = byte;
  return;
}

Assistant:

void Mapper2::ppu_write_byte(uint16_t addr, uint8_t byte) {
    if (addr <= kChrEnd) {
        chr_mem_.at(addr) = byte;
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    nametables_[index][addr_mod] = byte;
}